

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
TestRunnerSystemSemaphore::TestRunnerSystemSemaphore(TestRunnerSystemSemaphore *this)

{
  QNativeIpcKey *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  atomic<bool> *in_stack_ffffffffffffff90;
  size_t in_stack_ffffffffffffffa0;
  QNativeIpcKey *pQVar1;
  char16_t *str;
  char16_t local_48 [12];
  QNativeIpcKey local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::atomic<bool>::atomic(in_stack_ffffffffffffff90,SUB81((ulong)in_RDI >> 0x38,0));
  this_00 = (QNativeIpcKey *)(in_RDI + 8);
  str = local_48;
  Qt::Literals::StringLiterals::operator____s(str,in_stack_ffffffffffffffa0);
  pQVar1 = &local_30;
  QSystemSemaphore::platformSafeKey((QString *)pQVar1,(Type)str);
  QSystemSemaphore::QSystemSemaphore((QSystemSemaphore *)this_00,pQVar1,1,Open);
  QNativeIpcKey::~QNativeIpcKey(this_00);
  QString::~QString((QString *)0x11018c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TestRunnerSystemSemaphore() { }